

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv__cloexec(int fd,int set)

{
  int iVar1;
  int *piVar2;
  
  do {
    iVar1 = fcntl(fd,2,(ulong)(set != 0));
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        return 0;
      }
      break;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

int uv__cloexec(int fd, int set) {
  int flags;
  int r;

  flags = 0;
  if (set)
    flags = FD_CLOEXEC;

  do
    r = fcntl(fd, F_SETFD, flags);
  while (r == -1 && errno == EINTR);

  if (r)
    return UV__ERR(errno);

  return 0;
}